

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

void restore_dungeon(memfile *mf)

{
  int8_t iVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t iVar4;
  branch *pbVar5;
  long lVar6;
  branch **ppbVar7;
  dungeon *buf;
  
  mfmagic_check(mf,0x4e4744);
  mread(mf,&n_dgns,4);
  if (0 < n_dgns) {
    buf = dungeons;
    lVar6 = 0;
    do {
      mread(mf,buf,0x18);
      mread(mf,buf->proto,0xf);
      iVar1 = mread8(mf);
      buf->boneid = iVar1;
      uVar2 = mread32(mf);
      buf->flags = (d_flags)(uVar2 >> 0x15 & 0x70 |
                            uVar2 >> 0x19 & 8 |
                            uVar2 >> 0x1b & 4 | uVar2 >> 0x1d & 2 | uVar2 >> 0x1f);
      iVar1 = mread8(mf);
      buf->entry_lev = iVar1;
      iVar1 = mread8(mf);
      buf->num_dunlevs = iVar1;
      iVar1 = mread8(mf);
      buf->dunlev_ureached = iVar1;
      iVar3 = mread32(mf);
      buf->ledger_start = iVar3;
      iVar3 = mread32(mf);
      buf->depth_start = iVar3;
      lVar6 = lVar6 + 1;
      buf = buf + 1;
    } while (lVar6 < n_dgns);
  }
  mread(mf,&dungeon_topology,0x3e);
  mread(mf,tune,6);
  branches = (branch *)0x0;
  iVar3 = mread32(mf);
  if (0 < iVar3) {
    ppbVar7 = &((branch *)0x0)->next;
    do {
      pbVar5 = (branch *)malloc(0x18);
      pbVar5->next = (branch *)0x0;
      iVar4 = mread32(mf);
      pbVar5->id = iVar4;
      iVar4 = mread32(mf);
      pbVar5->type = iVar4;
      mread(mf,&pbVar5->end1,2);
      mread(mf,&pbVar5->end2,2);
      iVar1 = mread8(mf);
      if ((branch *)ppbVar7 == (branch *)0x0) {
        ppbVar7 = &branches;
      }
      pbVar5->end1_up = iVar1;
      ((branch *)ppbVar7)->next = pbVar5;
      iVar3 = iVar3 + -1;
      ppbVar7 = (branch **)pbVar5;
    } while (iVar3 != 0);
  }
  mread(mf,&inv_pos,2);
  return;
}

Assistant:

void restore_dungeon(struct memfile *mf)
{
    branch *curr, *last;
    int    count, i;

    mfmagic_check(mf, DGN_MAGIC);
    mread(mf, &n_dgns, sizeof(n_dgns));
    for (i = 0; i < n_dgns; i++)
	restore_dungeon_struct(mf, &dungeons[i]);
    mread(mf, &dungeon_topology, sizeof dungeon_topology);
    mread(mf, tune, sizeof tune);

    last = branches = NULL;

    count = mread32(mf);
    for (i = 0; i < count; i++) {
	curr = malloc(sizeof(branch));
	restore_branch(mf, curr);
	if (last)
	    last->next = curr;
	else
	    branches = curr;
	last = curr;
    }

    mread(mf, &inv_pos, sizeof(coord));
}